

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.cpp
# Opt level: O2

void DumpFunction(Proto *f,DumpState *D)

{
  TValue *pTVar1;
  uint uVar2;
  undefined8 in_RAX;
  DumpState *in_RCX;
  ulong uVar3;
  TString *s;
  ulong uVar4;
  int n;
  undefined8 local_38;
  
  local_38 = in_RAX;
  DumpInt(f->linedefined,D);
  DumpInt(f->lastlinedefined,D);
  DumpChar((uint)f->numparams,D);
  DumpChar((uint)f->is_vararg,D);
  DumpChar((uint)f->maxstacksize,D);
  DumpVector(f->code,f->sizecode,(size_t)D,in_RCX);
  uVar2 = f->sizek;
  DumpInt(uVar2,D);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    pTVar1 = f->k;
    DumpChar(*(uint *)((long)&pTVar1->tt_ + uVar3) & 0xf,D);
    uVar2 = *(uint *)((long)&pTVar1->tt_ + uVar3) & 0xf;
    if (uVar2 == 4) {
      DumpString(*(TString **)((long)&pTVar1->value_ + uVar3),D);
    }
    else if (uVar2 == 3) {
      local_38 = *(undefined8 *)((long)&pTVar1->value_ + uVar3);
      DumpBlock(&local_38,8,D);
    }
    else if (uVar2 == 1) {
      DumpChar(*(int *)((long)&pTVar1->value_ + uVar3),D);
    }
  }
  uVar2 = f->sizep;
  DumpInt(uVar2,D);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    DumpFunction(f->p[uVar3],D);
  }
  uVar2 = f->sizeupvalues;
  DumpInt(uVar2,D);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    DumpChar((uint)(&f->upvalues->instack)[uVar3],D);
    DumpChar((uint)(&f->upvalues->idx)[uVar3],D);
  }
  n = 0;
  if (D->strip == 0) {
    s = f->source;
  }
  else {
    s = (TString *)0x0;
  }
  DumpString(s,D);
  if (D->strip == 0) {
    n = f->sizelineinfo;
  }
  DumpVector(f->lineinfo,n,(size_t)D,in_RCX);
  uVar4 = 0;
  uVar2 = 0;
  if (D->strip == 0) {
    uVar2 = f->sizelocvars;
  }
  DumpInt(uVar2,D);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    DumpString(*(TString **)((long)&f->locvars->varname + uVar4),D);
    DumpInt(*(int *)((long)&f->locvars->startpc + uVar4),D);
    DumpInt(*(int *)((long)&f->locvars->endpc + uVar4),D);
  }
  uVar4 = 0;
  uVar2 = 0;
  if (D->strip == 0) {
    uVar2 = f->sizeupvalues;
  }
  DumpInt(uVar2,D);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    DumpString(*(TString **)((long)&f->upvalues->name + uVar4),D);
  }
  return;
}

Assistant:

static void DumpFunction(const Proto* f, DumpState* D)
{
 DumpInt(f->linedefined,D);
 DumpInt(f->lastlinedefined,D);
 DumpChar(f->numparams,D);
 DumpChar(f->is_vararg,D);
 DumpChar(f->maxstacksize,D);
 DumpCode(f,D);
 DumpConstants(f,D);
 DumpUpvalues(f,D);
 DumpDebug(f,D);
}